

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segment_o2.cc
# Opt level: O3

unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> __thiscall
lf::geometry::SegmentO2::SubGeometry(SegmentO2 *this,dim_t codim,dim_t i)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  double dVar3;
  SegmentO2 *this_00;
  runtime_error *this_01;
  uint in_ECX;
  ulong uVar4;
  ActualDstType actualDst;
  undefined4 in_register_00000034;
  long lVar5;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [392];
  
  if (i == 1) {
    if (2 < in_ECX) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 0x10),"i is out of bounds",0x12);
      paVar1 = &local_208.field_2;
      local_208._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"0 <= i && i <= 2","");
      paVar2 = &local_1e8.field_2;
      local_1e8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_208,&local_1e8,0x54,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      local_208._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
      local_1e8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
                 ,"");
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
      base::AssertionFailed(&local_208,&local_1e8,0x54,&local_1c8);
      goto LAB_0027a0f6;
    }
    Eigen::Block<const_Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_-1,_1,_true>::Block
              ((Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true> *)local_1a8,
               (Matrix<double,__1,_3,_0,__1,_3> *)(CONCAT44(in_register_00000034,codim) + 8),
               (ulong)in_ECX);
    this_00 = (SegmentO2 *)operator_new(0x18);
    local_208._M_dataplus._M_p = (pointer)0x0;
    local_208._M_string_length = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_208,
               local_1a8._8_8_,1);
    Eigen::internal::
    resize_if_allowed<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>const,_1,1,true>,double,double>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_208,
               (Block<const_Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true> *)local_1a8,
               (assign_op<double,_double> *)&local_1e8);
    uVar4 = local_208._M_string_length - ((long)local_208._M_string_length >> 0x3f) &
            0xfffffffffffffffe;
    if (1 < (long)local_208._M_string_length) {
      lVar5 = 0;
      do {
        dVar3 = ((double *)(local_1a8._0_8_ + lVar5 * 8))[1];
        *(double *)(local_208._M_dataplus._M_p + lVar5 * 8) =
             *(double *)(local_1a8._0_8_ + lVar5 * 8);
        *(double *)((long)(local_208._M_dataplus._M_p + lVar5 * 8) + 8) = dVar3;
        lVar5 = lVar5 + 2;
      } while (lVar5 < (long)uVar4);
    }
    if ((long)uVar4 < (long)local_208._M_string_length) {
      do {
        *(double *)(local_208._M_dataplus._M_p + uVar4 * 8) =
             *(double *)(local_1a8._0_8_ + uVar4 * 8);
        uVar4 = uVar4 + 1;
      } while (local_208._M_string_length != uVar4);
    }
    (this_00->super_Geometry)._vptr_Geometry = (_func_int **)&PTR_DimLocal_004245f8;
    (this_00->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
    m_data = (double *)local_208._M_dataplus._M_p;
    (this_00->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.
    m_rows = local_208._M_string_length;
  }
  else {
    if (i != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 0x10),"codim is out of bounds",0x16);
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_208,&local_1e8,0x57,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"this code should not be reached");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (in_ECX != 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1a8 + 0x10),"i is out of bounds",0x12);
      paVar1 = &local_208.field_2;
      local_208._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"i == 0","");
      paVar2 = &local_1e8.field_2;
      local_1e8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
                 ,"");
      std::__cxx11::stringbuf::str();
      base::AssertionFailed(&local_208,&local_1e8,0x50,&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != paVar2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
      local_208._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
      local_1e8._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1e8,
                 "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/segment_o2.cc"
                 ,"");
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
      base::AssertionFailed(&local_208,&local_1e8,0x50,&local_1c8);
LAB_0027a0f6:
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      abort();
    }
    this_00 = (SegmentO2 *)operator_new(0x60);
    Eigen::DenseStorage<double,_-1,_-1,_3,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_3,_0> *)local_1a8,
               (DenseStorage<double,__1,__1,_3,_0> *)(CONCAT44(in_register_00000034,codim) + 8));
    SegmentO2(this_00,(Matrix<double,__1,_3,_0,__1,_3> *)local_1a8);
    free((void *)local_1a8._0_8_);
  }
  (this->super_Geometry)._vptr_Geometry = (_func_int **)this_00;
  return (__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
          )(__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Geometry> SegmentO2::SubGeometry(dim_t codim, dim_t i) const {
  if (codim == 0) {
    LF_ASSERT_MSG(i == 0, "i is out of bounds");
    return std::make_unique<SegmentO2>(coords_);
  }
  if (codim == 1) {
    LF_ASSERT_MSG(0 <= i && i <= 2, "i is out of bounds");
    return std::make_unique<Point>(coords_.col(i));
  }
  LF_VERIFY_MSG(false, "codim is out of bounds");
}